

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void display_blow_message_vs_player(blow_method *method,char *m_name,player *p,wchar_t damage)

{
  _Bool _Var1;
  char *s;
  char *local_38;
  char *fullstop;
  char *act;
  wchar_t damage_local;
  player *p_local;
  char *m_name_local;
  blow_method *method_local;
  
  s = monster_blow_method_action(method,L'\xffffffff');
  if (s == (char *)0x0) {
    if ((L'\0' < damage) && (((p->opts).opt[3] & 1U) != 0)) {
      msgt(method->msgt,"You take %d damage.",(ulong)(uint)damage);
    }
  }
  else {
    local_38 = ".";
    _Var1 = suffix(s,"\'");
    if ((_Var1) || (_Var1 = suffix(s,"!"), _Var1)) {
      local_38 = "";
    }
    if ((damage < L'\x01') || (((p->opts).opt[3] & 1U) == 0)) {
      msgt(method->msgt,"%s %s%s",m_name,s,local_38);
    }
    else {
      msgt(method->msgt,"%s %s%s (%d)",m_name,s,local_38,(ulong)(uint)damage);
    }
    string_free(s);
  }
  return;
}

Assistant:

static void display_blow_message_vs_player(const struct blow_method *method,
		const char *m_name, struct player *p, int damage)
{
	char *act = monster_blow_method_action(method, -1);

	if (act) {
		const char *fullstop = ".";

		if (suffix(act, "'") || suffix(act, "!")) {
			fullstop = "";
		}
		if (damage > 0 && OPT(p, show_damage)) {
			msgt(method->msgt, "%s %s%s (%d)", m_name, act,
				fullstop, damage);
		} else {
			msgt(method->msgt, "%s %s%s", m_name, act, fullstop);
		}
		string_free(act);
	} else if (damage > 0 && OPT(p, show_damage)) {
		msgt(method->msgt, "You take %d damage.", damage);
	}
}